

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdTestCofs(Kit_DsdNtk_t *pNtk,uint *pTruthInit)

{
  undefined2 uVar1;
  uint *pOut;
  Kit_DsdNtk_t *pKVar2;
  Kit_DsdNtk_t *pNtk_00;
  Kit_DsdNtk_t *pNtk_01;
  long lVar3;
  uint iVar;
  
  uVar1 = pNtk->nVars;
  pOut = pNtk->pMem;
  lVar3 = 1;
  if (5 < (ushort)uVar1) {
    lVar3 = (long)(1 << ((char)uVar1 - 5U & 0x1f));
  }
  printf("Function: ");
  Extra_PrintHexadecimal(_stdout,pTruthInit,(uint)pNtk->nVars);
  putchar(10);
  Kit_DsdPrint(_stdout,pNtk);
  putchar(10);
  for (iVar = 0; iVar < pNtk->nVars; iVar = iVar + 1) {
    Kit_TruthCofactor0New(pOut,pTruthInit,(uint)pNtk->nVars,iVar);
    pKVar2 = Kit_DsdDecompose(pOut,(uint)pNtk->nVars);
    pNtk_00 = Kit_DsdExpand(pKVar2);
    Kit_DsdNtkFree(pKVar2);
    printf("Cof%d0: ",(ulong)iVar);
    Kit_DsdPrint(_stdout,pNtk_00);
    putchar(10);
    Kit_TruthCofactor1New(pOut + lVar3,pTruthInit,(uint)pNtk->nVars,iVar);
    pKVar2 = Kit_DsdDecompose(pOut + lVar3,(uint)pNtk->nVars);
    pNtk_01 = Kit_DsdExpand(pKVar2);
    Kit_DsdNtkFree(pKVar2);
    printf("Cof%d1: ",(ulong)iVar);
    Kit_DsdPrint(_stdout,pNtk_01);
    putchar(10);
    Kit_DsdNtkFree(pNtk_00);
    Kit_DsdNtkFree(pNtk_01);
  }
  putchar(10);
  return 0;
}

Assistant:

int Kit_DsdTestCofs( Kit_DsdNtk_t * pNtk, unsigned * pTruthInit )
{
    Kit_DsdNtk_t * pNtk0, * pNtk1, * pTemp;
//    Kit_DsdObj_t * pRoot;
    unsigned * pCofs2[2] = { pNtk->pMem, pNtk->pMem + Kit_TruthWordNum(pNtk->nVars) };
    unsigned i, * pTruth;
    int fVerbose = 1;
    int RetValue = 0;

    pTruth = pTruthInit;
//    pRoot = Kit_DsdNtkRoot(pNtk);
//    pTruth = Kit_DsdObjTruth(pRoot);
//    assert( pRoot->nFans == pNtk->nVars );

    if ( fVerbose )
    {
        printf( "Function: " );
//        Extra_PrintBinary( stdout, pTruth, (1 << pNtk->nVars) ); 
        Extra_PrintHexadecimal( stdout, pTruth, pNtk->nVars ); 
        printf( "\n" );
        Kit_DsdPrint( stdout, pNtk ), printf( "\n" );
    }
    for ( i = 0; i < pNtk->nVars; i++ )
    {
        Kit_TruthCofactor0New( pCofs2[0], pTruth, pNtk->nVars, i );
        pNtk0 = Kit_DsdDecompose( pCofs2[0], pNtk->nVars );
        pNtk0 = Kit_DsdExpand( pTemp = pNtk0 );
        Kit_DsdNtkFree( pTemp );

        if ( fVerbose )
        {
            printf( "Cof%d0: ", i );
            Kit_DsdPrint( stdout, pNtk0 ), printf( "\n" );
        }

        Kit_TruthCofactor1New( pCofs2[1], pTruth, pNtk->nVars, i );
        pNtk1 = Kit_DsdDecompose( pCofs2[1], pNtk->nVars );
        pNtk1 = Kit_DsdExpand( pTemp = pNtk1 );
        Kit_DsdNtkFree( pTemp );

        if ( fVerbose )
        {
            printf( "Cof%d1: ", i );
            Kit_DsdPrint( stdout, pNtk1 ), printf( "\n" );
        }

//        if ( Kit_DsdCheckVar4Dec2( pNtk0, pNtk1 ) )
//            RetValue = 1;

        Kit_DsdNtkFree( pNtk0 );
        Kit_DsdNtkFree( pNtk1 );
    }
    if ( fVerbose )
        printf( "\n" );

    return RetValue;
}